

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_suite.cpp
# Opt level: O0

void array_suite::fail_missing_end(void)

{
  error *ex;
  bool local_b4 [4];
  undefined1 local_b0 [4];
  bool value [4];
  iarchive in;
  value_type input [6];
  
  in.reader.stack.c.
  super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node._4_2_ = 0x8180;
  in.reader.stack.c.
  super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node._0_4_ = 0x81800492;
  trial::protocol::bintoken::iarchive::iarchive<unsigned_char[6]>
            ((iarchive *)local_b0,
             (uchar (*) [6])
             ((long)&in.reader.stack.c.
                     super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
                     ._M_impl.super__Deque_impl_data + 0x48));
  local_b4[0] = false;
  local_b4[1] = false;
  local_b4[2] = false;
  local_b4[3] = false;
  boost::archive::detail::interface_iarchive<trial::protocol::bintoken::iarchive>::operator>>
            ((interface_iarchive<trial::protocol::bintoken::iarchive> *)local_b0,&local_b4);
  trial::protocol::core::detail::throw_failed_impl
            ("in >> value","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_suite.cpp"
             ,0x129,"void array_suite::fail_missing_end()");
  trial::protocol::bintoken::iarchive::~iarchive((iarchive *)local_b0);
  return;
}

Assistant:

void fail_missing_end()
{
    const value_type input[] = { token::code::begin_array,
                                 0x04,
                                 0x80, 0x81, 0x80, 0x81 };
    format::iarchive in(input);
    bool value[4] = { false, false, false, false };
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(in >> value,
                                    format::error, "expected end array bracket");
}